

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O2

void get_type_info(void)

{
  time_t tVar1;
  int i;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::operator<<((ostream *)&std::cout,"\n Loop ");
}

Assistant:

void get_type_info() {
    using namespace L15_5;
    using std::cout;
    using std::endl;

    srand(time(0));
    Grand * pg;
    Superb * ps;
    for (int i = 0; i < 5; i++) {
        cout << "\n Loop " << i << ":\n";
        pg = get_one();
        cout << "Now processing type " << typeid(*pg).name() << "\n";
        pg ->speak();
        if (ps = dynamic_cast<Superb *>(pg)) {
            ps->say();
        }
        //  similar to 'pg instanceof Magnificent'
        if (typeid(Magnificent) == typeid(*pg)) {
            cout << "Yes, you area really magnificent.......\n";
        }
    }
}